

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_setint(lua_State *L,Table *t,lua_Integer key,TValue *value)

{
  TValue *slot;
  TValue *io;
  TValue k;
  int ok;
  uint ik;
  TValue *value_local;
  lua_Integer key_local;
  Table *t_local;
  lua_State *L_local;
  
  k._12_4_ = checkrange(key,t->asize);
  if (k._12_4_ == 0) {
    slot = getintfromhash(t,key);
    k._8_4_ = rawfinishnodeset(slot,value);
    if (k._8_4_ == 0) {
      k.value_.ub = '\x03';
      io = (TValue *)key;
      luaH_newkey(L,t,(TValue *)&io,value);
    }
  }
  else {
    *(lu_byte *)((long)t->array + (ulong)(k._12_4_ - 1) + 4) = value->tt_;
    t->array[-1 - (ulong)(k._12_4_ - 1)] = value->value_;
  }
  return;
}

Assistant:

void luaH_setint (lua_State *L, Table *t, lua_Integer key, TValue *value) {
  unsigned ik = ikeyinarray(t, key);
  if (ik > 0)
    obj2arr(t, ik - 1, value);
  else {
    int ok = rawfinishnodeset(getintfromhash(t, key), value);
    if (!ok) {
      TValue k;
      setivalue(&k, key);
      luaH_newkey(L, t, &k, value);
    }
  }
}